

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int NULLCFile::FileWriteType<char>(char data,File *file)

{
  size_t sVar1;
  File *file_local;
  char data_local;
  
  file_local._3_1_ = data;
  if (file == (File *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    file_local._4_4_ = 0;
  }
  else if (file->handle == (FILE *)0x0) {
    nullcThrowError("Cannot write to a closed file.");
    file_local._4_4_ = 0;
  }
  else {
    sVar1 = fwrite((void *)((long)&file_local + 3),1,1,(FILE *)file->handle);
    file_local._4_4_ = (uint)(sVar1 == 1);
  }
  return file_local._4_4_;
}

Assistant:

int FileWriteType(T data, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot write to a closed file.");
			return 0;
		}

		return 1 == fwrite(&data, sizeof(T), 1, file->handle);
	}